

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmakefilegenerator.cpp
# Opt level: O0

string * __thiscall
CMakeFileGenerator::generateCode_abi_cxx11_(string *__return_storage_ptr__,CMakeFileGenerator *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  undefined1 local_19;
  CMakeFileGenerator *local_18;
  CMakeFileGenerator *this_local;
  string *code;
  
  local_19 = 0;
  local_18 = this;
  this_local = (CMakeFileGenerator *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::__cxx11::string::operator+=
            ((string *)__return_storage_ptr__,"cmake_minimum_required(VERSION 2.8.7)\n");
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"# find YARP\n");
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"find_package(YARP REQUIRED)\n")
  ;
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\n");
  std::__cxx11::string::operator+=
            ((string *)__return_storage_ptr__,"# add YARP include directories\n");
  std::__cxx11::string::operator+=
            ((string *)__return_storage_ptr__,"include_directories(${YARP_INCLUDE_DIRS})\n");
  std::__cxx11::string::operator+=
            ((string *)__return_storage_ptr__,"include_directories(${CMAKE_CURRENT_SOURCE_DIR})\n");
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\n");
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"# set up our program\n");
  std::operator+(&local_b0,"add_executable(",&this->cpp_file_name);
  std::operator+(&local_90,&local_b0," ");
  std::operator+(&local_70,&local_90,&this->cpp_file_name);
  std::operator+(&local_50,&local_70,".cpp)\n");
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\n");
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"# link with YARP libraries\n");
  std::operator+(&local_f0,"target_link_libraries(",&this->cpp_file_name);
  std::operator+(&local_d0,&local_f0," ${YARP_LIBRARIES})\n");
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_f0);
  return __return_storage_ptr__;
}

Assistant:

std::string CMakeFileGenerator::generateCode() {
  std::string code;

  //code += "    outputPort.write(bottleToSend);\n";
  code += "cmake_minimum_required(VERSION 2.8.7)\n";
  code += "# find YARP\n";
  code += "find_package(YARP REQUIRED)\n";
  code += "\n";
  code += "# add YARP include directories\n";
  code += "include_directories(${YARP_INCLUDE_DIRS})\n";
  code += "include_directories(${CMAKE_CURRENT_SOURCE_DIR})\n";
  code += "\n";
  code += "# set up our program\n";
  code += "add_executable(" + cpp_file_name + " " + cpp_file_name + ".cpp)\n";
  code += "\n";
  code += "# link with YARP libraries\n";
  code += "target_link_libraries(" + cpp_file_name +" ${YARP_LIBRARIES})\n";
  return code;
}